

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  int iVar1;
  U32 UVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  iVar3 = 0x10;
  iVar1 = (int)size / 0x10;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  lVar4 = 0;
  for (iVar5 = 0; iVar5 != iVar1; iVar5 = iVar5 + 1) {
    for (lVar6 = 0; iVar3 + lVar4 != lVar6; lVar6 = lVar6 + 1) {
      UVar2 = table[lVar6] - reducerValue;
      if (table[lVar6] < reducerValue) {
        UVar2 = 0;
      }
      table[lVar6] = UVar2;
    }
    lVar4 = lVar4 + -0x10;
    iVar3 = iVar3 + 0x10;
    table = table + 0x10;
  }
  return;
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}